

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bv.c
# Opt level: O2

unsigned_long bv_get_bits(bv_t *bv,uint numbits)

{
  uint uVar1;
  uchar *puVar2;
  unsigned_long uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  char *__assertion;
  long lVar7;
  
  if (bv == (bv_t *)0x0) {
    __assertion = "bv != NULL";
    uVar1 = 0x4c;
  }
  else {
    puVar2 = bv->data;
    if (puVar2 == (uchar *)0x0) {
      __assertion = "bv->data != NULL";
      uVar1 = 0x4d;
    }
    else {
      uVar1 = bv->idx;
      if (uVar1 < bv->len) {
        uVar4 = uVar1 & 7;
        bv->idx = uVar1 + numbits;
        if (8 - uVar4 < numbits) {
          uVar5 = (ulong)((2 << ((byte)uVar4 ^ 7)) - 1U & (uint)puVar2[uVar1 >> 3]);
          for (lVar7 = 1; (uint)lVar7 < numbits + uVar4 >> 3; lVar7 = lVar7 + 1) {
            uVar5 = uVar5 << 8 | (ulong)puVar2[lVar7 + (ulong)(uVar1 >> 3)];
          }
          bVar6 = (byte)(numbits + uVar4) & 7;
          uVar3 = (ulong)(puVar2[lVar7 + (ulong)(uVar1 >> 3)] >> (8 - bVar6 & 0x1f)) |
                  uVar5 << bVar6;
        }
        else {
          uVar3 = (unsigned_long)
                  (((uint)puVar2[uVar1 >> 3] << (byte)uVar4 & 0xff) >> (8U - (char)numbits & 0x1f));
        }
        return uVar3;
      }
      __assertion = "bv->len > bv->idx";
      uVar1 = 0x50;
    }
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",
                uVar1,"unsigned long bv_get_bits(bv_t *, unsigned int)");
}

Assistant:

unsigned long bv_get_bits(bv_t *bv, unsigned int numbits) {
  assert(bv != NULL);
  assert(bv->data != NULL);
  assert((numbits <= 32) ||
         "Can not read more than 32 bits from a bit vector");
  assert(bv->len > bv->idx);
  assert(((bv->len - bv->idx) > numbits) ||
         "Bit buffer of bit vector is too small");

  unsigned int cidx = bv->idx >> 3;      /* char index */
  /*M
    Bit overflow from previous char.
  **/
  unsigned int overflow = bv->idx & 0x7;

  bv->idx += numbits;

  /*M
    Most significant bit first.
  **/
  if (numbits <= (8 - overflow))
    return HIGHERBITS(bv->data[cidx] << overflow, numbits);

  /*M
    Length in bytes of bitstring.
  **/
  unsigned int len = ((numbits + overflow) >> 3) + 1;
  /*M
    Number of bits of bitstring in first byte.
  **/
  unsigned long res = LOWERBITS(bv->data[cidx++], 8 - overflow);
  unsigned int i;
  for (i = 1; i < len - 1; i++)
    res = (res << 8) | (bv->data[cidx++] & 0xFF);

  /*M
    Number of bits in last byte.
  **/
  unsigned int lastbits = (overflow + numbits) & 0x07;
  res = (res << lastbits) | HIGHERBITS(bv->data[cidx], lastbits);

  return res;
}